

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O2

optional<EncodingConversion> *
transcoding_to(optional<EncodingConversion> *__return_storage_ptr__,char *name)

{
  int iVar1;
  iconv_t pvVar2;
  EncodingConversion local_20;
  
  iVar1 = strcmp(name,"UTF-8");
  if (iVar1 == 0) {
    (__return_storage_ptr__->value).data = (void *)0x0;
    (__return_storage_ptr__->value).mode = 1;
  }
  else {
    pvVar2 = iconv_open(name,"UTF-16LE");
    if (pvVar2 == (iconv_t)0xffffffffffffffff) {
      (__return_storage_ptr__->value).data = (void *)0x0;
      (__return_storage_ptr__->value).mode = 0;
      __return_storage_ptr__->is_some = false;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->value).data = pvVar2;
    (__return_storage_ptr__->value).mode = 0;
  }
  local_20.mode = 0;
  local_20.data = (void *)0x0;
  __return_storage_ptr__->is_some = true;
  EncodingConversion::~EncodingConversion(&local_20);
  return __return_storage_ptr__;
}

Assistant:

optional<EncodingConversion> transcoding_to(const char *name) {
  if (strcmp(name, "UTF-8") == 0) {
    return optional { EncodingConversion{UTF16_TO_UTF8, nullptr} };
  } else {
    iconv_t conversion = iconv_open(name, "UTF-16LE");
    return conversion == reinterpret_cast<iconv_t>(-1) ?
      optional<EncodingConversion>{} :
      optional { EncodingConversion(GENERAL, conversion) };
  }
}